

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getQueryParam
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  char *pcVar2;
  vm_val_t *ret;
  vm_httpreq_ext *pvVar3;
  char *__s;
  size_t sVar4;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjHTTPRequest *in_RDI;
  bool bVar5;
  char *eq;
  char *amp;
  char *qq;
  size_t ql;
  char *q;
  TadsHttpRequest *req;
  size_t paramLen;
  char *paramName;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff58;
  uint *in_stack_ffffffffffffff60;
  vm_val_t *in_stack_ffffffffffffff68;
  int local_8c;
  char *local_80;
  char *local_78;
  char *local_70;
  TadsHttpRequest *str;
  
  if (in_RCX == (int *)0x0) {
    local_8c = 0;
  }
  else {
    local_8c = *in_RCX;
  }
  if ((getp_getQueryParam(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getQueryParam(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getQueryParam::desc,1);
    __cxa_guard_release(&getp_getQueryParam(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff58);
  if (iVar1 == 0) {
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff58);
    if (pcVar2 == (char *)0x0) {
      err_throw(0);
    }
    ret = (vm_val_t *)vmb_get_len((char *)0x2548c9);
    pvVar3 = get_ext(in_RDI);
    str = pvVar3->req;
    __s = StringRef::get(str->resource_name);
    sVar4 = strlen(__s);
    vm_val_t::set_nil(in_RDX);
    local_70 = strchr(__s,0x3f);
    while( true ) {
      bVar5 = false;
      if (local_70 != (char *)0x0) {
        bVar5 = *local_70 != '\0';
      }
      if (!bVar5) goto LAB_00254a63;
      local_70 = local_70 + 1;
      local_78 = strchr(local_70,0x26);
      if (local_78 == (char *)0x0) {
        local_78 = __s + sVar4;
      }
      local_80 = strchr(local_70,0x3d);
      if ((local_80 == (char *)0x0) || (local_78 < local_80)) {
        local_80 = local_78;
      }
      if (((vm_val_t *)(local_80 + -(long)local_70) == ret) &&
         (iVar1 = memcmp(local_70,pcVar2 + 2,(size_t)ret), iVar1 == 0)) break;
      local_70 = local_78;
    }
    new_parsed_str(ret,(char *)str,(size_t)__s,(int)(sVar4 >> 0x20));
LAB_00254a63:
    CVmStack::discard(local_8c);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getQueryParam(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the target parameter name */
    const char *paramName = G_stk->get(0)->get_as_string(vmg0_);
    if (paramName == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer from the string */
    size_t paramLen = vmb_get_len(paramName);
    paramName += VMB_LEN;

    /* retrieve the query string from the request */
    TadsHttpRequest *req = get_ext()->req;
    const char *q = req->resource_name->get();
    size_t ql = strlen(q);

    /* presume we won't find the parameter we're looking for */
    retval->set_nil();

    /* scan the parameters, if any */
    for (const char *qq = strchr(q, '?') ; qq != 0 && *qq != '\0' ; )
    {
        /* skip this separator character */
        ++qq;

        /* find the end of this parameter */
        const char *amp = strchr(qq, '&');
        if (amp == 0)
            amp = q + ql;

        /* find the value portion, if present */
        const char *eq = strchr(qq, '=');
        if (eq == 0 || eq > amp)
            eq = amp;

        /* 
         *   Compare this to the name we're looking for.  Note that URLs are
         *   either plain ASCII or UTF-8, so we can just do the comparison on
         *   a byte-by-byte basis as our paramName string is also UTF-8.  
         */
        if ((size_t)(eq - qq) == paramLen
            && memcmp(qq, paramName, paramLen) == 0)
        {
            /* this is the one - create the value string */
            new_parsed_str(vmg_ retval, eq + 1,
                           eq == amp ? 0 : amp - eq - 1, ENCMODE_URL);

            /* done with our search */
            break;
        }

        /* move on to the next separator */
        qq = amp;
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}